

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_generated_dispatch.c
# Opt level: O0

PFNGLGETNAMEDBUFFERSUBDATAPROC epoxy_glGetNamedBufferSubData_resolver(void)

{
  PFNGLGETNAMEDBUFFERSUBDATAPROC p_Var1;
  
  p_Var1 = (PFNGLGETNAMEDBUFFERSUBDATAPROC)
           gl_provider_resolver
                     ("glGetNamedBufferSubData",epoxy_glGetNamedBufferSubData_resolver::providers,
                      epoxy_glGetNamedBufferSubData_resolver::entrypoints);
  return p_Var1;
}

Assistant:

static PFNGLGETNAMEDBUFFERSUBDATAPROC
epoxy_glGetNamedBufferSubData_resolver(void)
{
    static const enum gl_provider providers[] = {
        Desktop_OpenGL_4_5,
        GL_extension_GL_ARB_direct_state_access,
        gl_provider_terminator
    };
    static const uint32_t entrypoints[] = {
        20755 /* "glGetNamedBufferSubData" */,
        20755 /* "glGetNamedBufferSubData" */,
    };
    return gl_provider_resolver(entrypoint_strings + 20755 /* "glGetNamedBufferSubData" */,
                                providers, entrypoints);
}